

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateStubMethods
          (ServiceGenerator *this,Printer *printer)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  Options *options;
  Descriptor *pDVar4;
  AlphaNum *a;
  string_view sVar5;
  Sub *local_518;
  basic_string_view<char,_std::char_traits<char>_> local_498;
  undefined1 local_481;
  AlphaNum local_480;
  string local_450;
  allocator<char> local_429;
  string local_428;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  basic_string_view<char,_std::char_traits<char>_> local_378 [2];
  allocator<char> local_351;
  string local_350;
  Sub *local_330;
  Sub local_328;
  Sub local_270;
  Sub local_1b8;
  Sub local_100;
  iterator local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  undefined1 local_28 [8];
  MethodDescriptor *method;
  undefined8 uStack_18;
  int i;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  method._4_4_ = 0;
  uStack_18 = printer;
  printer_local = (Printer *)this;
  while( true ) {
    iVar1 = method._4_4_;
    iVar3 = ServiceDescriptor::method_count(this->descriptor_);
    if (iVar3 <= iVar1) break;
    local_28 = (undefined1  [8])ServiceDescriptor::method(this->descriptor_,method._4_4_);
    uVar2 = uStack_18;
    local_481 = 1;
    local_330 = &local_328;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"name",&local_351);
    sVar5 = MethodDescriptor::name((MethodDescriptor *)local_28);
    local_378[0]._M_str = sVar5._M_str;
    options = (Options *)sVar5._M_len;
    local_378[0]._M_len = (size_t)options;
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              (&local_328,&local_350,local_378);
    local_330 = &local_270;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"input",&local_399);
    pDVar4 = MethodDescriptor::input_type((MethodDescriptor *)local_28);
    QualifiedClassName_abi_cxx11_(&local_3c0,(cpp *)pDVar4,(Descriptor *)this->options_,options);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_270,&local_398,&local_3c0);
    local_330 = &local_1b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"output",&local_3e1);
    pDVar4 = MethodDescriptor::output_type((MethodDescriptor *)local_28);
    QualifiedClassName_abi_cxx11_(&local_408,(cpp *)pDVar4,(Descriptor *)this->options_,options);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_1b8,&local_3e0,&local_408);
    local_330 = &local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"index",&local_429);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_480,method._4_4_);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_450,(lts_20250127 *)&local_480,a);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_100,&local_428,&local_450);
    local_481 = 0;
    local_48 = &local_328;
    local_40 = 4;
    v._M_len = 4;
    v._M_array = local_48;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_38._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_498,
               "\n          void $classname$_Stub::$name$(\n              $pb$::RpcController* $nullable$ controller,\n              const $input$* $nonnull$ request, $output$* $nonnull$ response,\n              ::google::protobuf::Closure* $nullable$ done) {\n            channel_->CallMethod(descriptor()->method($index$), controller,\n                                 request, response, done);\n          }\n        "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)uVar2,local_38._M_allocated_capacity,local_38._8_8_,
                      local_498._M_len,local_498._M_str);
    local_518 = (Sub *)&local_48;
    do {
      local_518 = local_518 + -1;
      io::Printer::Sub::~Sub(local_518);
    } while (local_518 != &local_328);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
    method._4_4_ = method._4_4_ + 1;
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateStubMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
            {"index", absl::StrCat(i)},
        },
        R"cc(
          void $classname$_Stub::$name$(
              $pb$::RpcController* $nullable$ controller,
              const $input$* $nonnull$ request, $output$* $nonnull$ response,
              ::google::protobuf::Closure* $nullable$ done) {
            channel_->CallMethod(descriptor()->method($index$), controller,
                                 request, response, done);
          }
        )cc");
  }
}